

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::GetBitFieldName_abi_cxx11_
          (string *__return_storage_ptr__,java *this,int index)

{
  int i;
  string local_48;
  allocator local_16;
  undefined1 local_15;
  uint local_14;
  string *psStack_10;
  int index_local;
  string *varName;
  
  local_14 = (uint)this;
  local_15 = 0;
  psStack_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"bitField",&local_16);
  std::allocator<char>::~allocator((allocator<char> *)&local_16);
  SimpleItoa_abi_cxx11_(&local_48,(protobuf *)(ulong)local_14,i);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_");
  return __return_storage_ptr__;
}

Assistant:

string GetBitFieldName(int index) {
  string varName = "bitField";
  varName += SimpleItoa(index);
  varName += "_";
  return varName;
}